

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase336::run(TestCase336 *this)

{
  undefined4 *firstElement;
  
  firstElement = (undefined4 *)
                 _::HeapArrayDisposer::allocateImpl
                           (4,0,4,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  *firstElement = 1;
  firstElement[1] = 4;
  firstElement[2] = 9;
  firstElement[3] = 0x10;
  _::HeapArrayDisposer::disposeImpl
            ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,firstElement,4,4,4,
             (_func_void_void_ptr *)0x0);
  return;
}

Assistant:

TEST(Array, MapRawArray) {
  uint foo[4] = {1, 2, 3, 4};
  Array<uint> bar = KJ_MAP(i, foo) -> uint { return i * i; };
  ASSERT_EQ(4, bar.size());
  EXPECT_EQ(1, bar[0]);
  EXPECT_EQ(4, bar[1]);
  EXPECT_EQ(9, bar[2]);
  EXPECT_EQ(16, bar[3]);
}